

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O2

CURLcode send_telnet_data(connectdata *conn,char *buffer,ssize_t nread)

{
  char cVar1;
  int iVar2;
  CURLcode CVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ssize_t bytes_written;
  pollfd pfd [1];
  
  lVar4 = 0;
  lVar8 = 0;
  if (0 < nread) {
    lVar8 = nread;
  }
  for (lVar6 = 0; lVar8 != lVar6; lVar6 = lVar6 + 1) {
    lVar4 = lVar4 + (ulong)(buffer[lVar6] == -1);
  }
  lVar6 = nread + lVar4;
  pcVar5 = buffer;
  if (lVar4 != 0) {
    pcVar5 = (char *)(*Curl_cmalloc)(lVar6 + 1);
    if (pcVar5 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    lVar7 = 0;
    for (lVar4 = 0; lVar8 != lVar4; lVar4 = lVar4 + 1) {
      cVar1 = buffer[lVar4];
      pcVar5[lVar7] = cVar1;
      if (cVar1 == -1) {
        pcVar5[lVar7 + 1] = -1;
        lVar7 = lVar7 + 2;
      }
      else {
        lVar7 = lVar7 + 1;
      }
    }
    pcVar5[lVar7] = '\0';
  }
  CVar3 = CURLE_OK;
  lVar8 = 0;
  while ((CVar3 == CURLE_OK && (lVar6 - lVar8 != 0 && lVar8 <= lVar6))) {
    pfd[0].fd = conn->sock[0];
    pfd[0].events = 4;
    iVar2 = Curl_poll(pfd,1,-1);
    if (iVar2 + 1U < 2) {
      CVar3 = CURLE_SEND_ERROR;
    }
    else {
      bytes_written = 0;
      CVar3 = Curl_write(conn,conn->sock[0],pcVar5 + lVar8,lVar6 - lVar8,&bytes_written);
      lVar8 = lVar8 + bytes_written;
    }
  }
  if (pcVar5 != buffer) {
    (*Curl_cfree)(pcVar5);
  }
  return CVar3;
}

Assistant:

static CURLcode send_telnet_data(struct connectdata *conn,
                                 char *buffer, ssize_t nread)
{
  ssize_t escapes, i, j, outlen;
  unsigned char *outbuf = NULL;
  CURLcode result = CURLE_OK;
  ssize_t bytes_written, total_written;

  /* Determine size of new buffer after escaping */
  escapes = 0;
  for(i = 0; i < nread; i++)
    if((unsigned char)buffer[i] == CURL_IAC)
      escapes++;
  outlen = nread + escapes;

  if(outlen == nread)
    outbuf = (unsigned char *)buffer;
  else {
    outbuf = malloc(nread + escapes + 1);
    if(!outbuf)
      return CURLE_OUT_OF_MEMORY;

    j = 0;
    for(i = 0; i < nread; i++) {
      outbuf[j++] = buffer[i];
      if((unsigned char)buffer[i] == CURL_IAC)
        outbuf[j++] = CURL_IAC;
    }
    outbuf[j] = '\0';
  }

  total_written = 0;
  while(!result && total_written < outlen) {
    /* Make sure socket is writable to avoid EWOULDBLOCK condition */
    struct pollfd pfd[1];
    pfd[0].fd = conn->sock[FIRSTSOCKET];
    pfd[0].events = POLLOUT;
    switch(Curl_poll(pfd, 1, -1)) {
      case -1:                    /* error, abort writing */
      case 0:                     /* timeout (will never happen) */
        result = CURLE_SEND_ERROR;
        break;
      default:                    /* write! */
        bytes_written = 0;
        result = Curl_write(conn, conn->sock[FIRSTSOCKET],
                            outbuf + total_written,
                            outlen - total_written,
                            &bytes_written);
        total_written += bytes_written;
        break;
    }
  }

  /* Free malloc copy if escaped */
  if(outbuf != (unsigned char *)buffer)
    free(outbuf);

  return result;
}